

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::BasicWriter<char>::write_unsigned_decimal<unsigned_int>
          (BasicWriter<char> *this,uint value,uint prefix_size)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  Buffer<char> *pBVar7;
  char *pcVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  
  uVar5 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  iVar6 = uVar5 - (value < internal::BasicData<void>::POWERS_OF_10_32[uVar5]);
  pBVar1 = this->buffer_;
  sVar2 = pBVar1->size_;
  uVar11 = (iVar6 + prefix_size + 1) + sVar2;
  pBVar7 = pBVar1;
  if (pBVar1->capacity_ < uVar11) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar11);
    pBVar7 = this->buffer_;
  }
  pBVar1->size_ = uVar11;
  pcVar3 = pBVar7->ptr_;
  pcVar8 = pcVar3 + sVar2 + (ulong)(iVar6 + 1) + (ulong)prefix_size;
  uVar5 = value;
  if (99 < value) {
    do {
      value = uVar5 / 100;
      *(undefined2 *)(pcVar8 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uVar5 % 100) * 2);
      pcVar8 = pcVar8 + -2;
      bVar4 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar4);
  }
  if (value < 10) {
    bVar9 = (byte)value | 0x30;
    lVar10 = -1;
  }
  else {
    pcVar8[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                 [((ulong)value * 2 & 0xffffffff) + 1];
    bVar9 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(ulong)value * 2];
    lVar10 = -2;
  }
  pcVar8[lVar10] = bVar9;
  return pcVar3 + sVar2;
}

Assistant:

Char *write_unsigned_decimal(UInt value, unsigned prefix_size = 0) {
    unsigned num_digits = internal::count_digits(value);
    Char *ptr = get(grow_buffer(prefix_size + num_digits));
    internal::format_decimal(ptr + prefix_size, value, num_digits);
    return ptr;
  }